

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaReleaseLast
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  pRVar3 = (this->super_RepeatedPtrFieldBase).rep_;
  iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
  (this->super_RepeatedPtrFieldBase).current_size_ = iVar1 + -1;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  return pbVar4;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::UnsafeArenaReleaseLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  typename TypeHandler::Type* result =
      cast<TypeHandler>(rep_->elements[--current_size_]);
  --rep_->allocated_size;
  if (current_size_ < rep_->allocated_size) {
    // There are cleared elements on the end; replace the removed element
    // with the last allocated element.
    rep_->elements[current_size_] = rep_->elements[rep_->allocated_size];
  }
  return result;
}